

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
               (OpCode op,OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  byte bVar1;
  byte bVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  FunctionProxy *pFVar6;
  ParseableFunctionInfo *pPVar7;
  undefined4 extraout_var_00;
  undefined4 *puVar8;
  FunctionProxy *pfuncActual_1;
  FunctionProxy *pfuncActual;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data_local;
  OpCode op_local;
  
  if (op != LdSlot) {
    if (op == NewScFuncHomeObj) {
LAB_00b29156:
      pFVar6 = ParseableFunctionInfo::GetNestedFunctionProxy
                         (&dumpFunction->super_ParseableFunctionInfo,(uint)data->SlotIndex);
      bVar1 = data->Value;
      bVar2 = data->Instance;
      pPVar7 = FunctionProxy::EnsureDeserialized(pFVar6);
      iVar5 = (*(pPVar7->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[7])();
      Output::Print(L" R%d = hmo:R%d, %s()",(ulong)bVar1,(ulong)bVar2,
                    CONCAT44(extraout_var_00,iVar5));
      return;
    }
    if (op != LdObjSlot) {
      if ((op != StObjSlot) && (op != StObjSlotChkUndecl)) {
        if ((ushort)(op - NewInnerScFunc) < 3) {
          pFVar6 = ParseableFunctionInfo::GetNestedFunctionProxy
                             (&dumpFunction->super_ParseableFunctionInfo,(uint)data->SlotIndex);
          bVar1 = data->Value;
          bVar2 = data->Instance;
          pPVar7 = FunctionProxy::EnsureDeserialized(pFVar6);
          iVar5 = (*(pPVar7->super_FunctionProxy).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
          Output::Print(L" R%d = env:R%d, %s()",(ulong)bVar1,(ulong)bVar2,
                        CONCAT44(extraout_var,iVar5));
          return;
        }
        if (op == NewScGenFuncHomeObj) goto LAB_00b29156;
        if (op != StPropIdArrFromVar) {
          if (op == LdSlotArr) goto LAB_00b291d8;
          if (1 < (ushort)(op - StSlot)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                        ,0x36d,"(false)","Unknown OpCode for OpLayoutElementSlot");
            if (bVar4) {
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
              return;
            }
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
        }
      }
      Output::Print(L" R%d[%d] = R%d ",(ulong)data->Instance,(ulong)data->SlotIndex,
                    (ulong)data->Value);
      return;
    }
  }
LAB_00b291d8:
  Output::Print(L" R%d = R%d[%d] ",(ulong)data->Value,(ulong)data->Instance,(ulong)data->SlotIndex);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementSlot(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::NewInnerStackScFunc:
            case OpCode::NewInnerScFunc:
            case OpCode::NewInnerScGenFunc:
            {
                FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
                Output::Print(_u(" R%d = env:R%d, %s()"), data->Value, data->Instance,
                        pfuncActual->EnsureDeserialized()->GetDisplayName());
                break;
            }
            case OpCode::NewScFuncHomeObj:
            case OpCode::NewScGenFuncHomeObj:
            {
                FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
                Output::Print(_u(" R%d = hmo:R%d, %s()"), data->Value, data->Instance,
                    pfuncActual->EnsureDeserialized()->GetDisplayName());
                break;
            }
#if ENABLE_NATIVE_CODEGEN
            case OpCode::StSlot:
            case OpCode::StSlotChkUndecl:
#endif
            case OpCode::StObjSlot:
            case OpCode::StObjSlotChkUndecl:
            case OpCode::StPropIdArrFromVar:
                Output::Print(_u(" R%d[%d] = R%d "),data->Instance,data->SlotIndex,data->Value);
                break;
            case OpCode::LdSlot:
#if ENABLE_NATIVE_CODEGEN
            case OpCode::LdSlotArr:
#endif
            case OpCode::LdObjSlot:
                Output::Print(_u(" R%d = R%d[%d] "),data->Value,data->Instance,data->SlotIndex);
                break;
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementSlot");
                break;
            }
        }
    }